

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O2

int __thiscall asl::SocketServer::bind(SocketServer *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  undefined4 in_register_00000034;
  Socket server;
  String local_38;
  
  Socket::Socket(&server);
  iVar1 = (**(code **)(*(long *)server.super_SmartObject._p + 0x30))
                    (server.super_SmartObject._p,CONCAT44(in_register_00000034,__fd),
                     (ulong)__addr & 0xffffffff);
  if ((char)iVar1 == '\0') {
    (**(code **)(*(long *)server.super_SmartObject._p + 0x80))(&local_38);
    String::operator=(&this->_socketError,&local_38);
    String::~String(&local_38);
  }
  else {
    (**(code **)(*(long *)server.super_SmartObject._p + 0x40))(server.super_SmartObject._p,0x28);
    Sockets::operator<<(&this->_sockets,&server);
  }
  SmartObject::~SmartObject(&server.super_SmartObject);
  return iVar1;
}

Assistant:

bool SocketServer::bind(const String& ip, int port)
{
	Socket server;
	if(server.bind(ip, port))
	{
		server.listen(40);
		_sockets << server;
		return true;
	}
	_socketError = server.errorMsg();
	return false;
}